

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O3

string * __thiscall
cmLinkLineComputer::ConvertToLinkReference
          (string *__return_storage_ptr__,cmLinkLineComputer *this,string *lib)

{
  pointer pcVar1;
  bool bVar2;
  char *pcVar3;
  cmStateDirectory *this_00;
  allocator local_71;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (lib->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + lib->_M_string_length);
  this_00 = &this->StateDir;
  pcVar3 = cmStateDirectory::GetCurrentBinary(this_00);
  std::__cxx11::string::string((string *)&local_70,pcVar3,(allocator *)&local_50);
  bVar2 = cmOutputConverter::ContainedInDirectory(&local_70,lib,this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    pcVar3 = cmStateDirectory::GetCurrentBinary(this_00);
    std::__cxx11::string::string((string *)&local_50,pcVar3,&local_71);
    cmOutputConverter::ForceToRelativePath(&local_70,&local_50,lib);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLinkLineComputer::ConvertToLinkReference(
  std::string const& lib) const
{
  std::string relLib = lib;

  if (cmOutputConverter::ContainedInDirectory(
        this->StateDir.GetCurrentBinary(), lib, this->StateDir)) {
    relLib = cmOutputConverter::ForceToRelativePath(
      this->StateDir.GetCurrentBinary(), lib);
  }
  return relLib;
}